

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

var cs::function::call_vv(function *_this,vector *args)

{
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  element_type *peVar4;
  var *this;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  long in_RSI;
  proxy *in_RDI;
  var *unaff_retaddr;
  char (*in_stack_00000008) [5];
  domain_manager *in_stack_00000010;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  size_t i;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *arr;
  var arg_list;
  fcall_guard fcall;
  scope_guard scope;
  _Self *in_stack_fffffffffffffe58;
  process_context *in_stack_fffffffffffffe60;
  statement_base *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  any *in_stack_ffffffffffffff10;
  var *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  domain_manager *in_stack_ffffffffffffff50;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_78;
  long local_58;
  size_type local_50;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_48;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  process_context::poll_event(in_stack_fffffffffffffe60);
  scope_guard::scope_guard
            ((scope_guard *)in_stack_fffffffffffffe60,(context_t *)in_stack_fffffffffffffe58);
  fcall_guard::fcall_guard
            ((fcall_guard *)in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
  if ((*(byte *)(local_10 + 0x10) & 1) != 0) {
    cs_debugger_func_callback(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  cs_impl::any::make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>();
  local_48 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                       (in_stack_ffffffffffffff10);
  local_50 = 0;
  if ((*(byte *)(local_10 + 0x40) & 1) == 0) {
    if ((*(byte *)(local_10 + 0x42) & 1) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1ee6c9);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1ee6d5);
      sVar1 = local_50;
      local_50 = local_50 + 1;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_18,sVar1);
      domain_manager::add_var_no_return<char_const(&)[5]>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
  }
  else {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ee635);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1ee641);
    sVar1 = local_50;
    local_50 = local_50 + 1;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_18,sVar1);
    domain_manager::add_var_no_return<char_const(&)[5]>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  for (; sVar1 = local_50,
      sVar3 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(local_18),
      sVar1 < sVar3; local_50 = local_50 + 1) {
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_18,local_50);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe60,
               (value_type *)in_stack_fffffffffffffe58);
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ee79a);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ee7a6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffe60);
  domain_manager::add_var_no_return<std::__cxx11::string_const&>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  cs_impl::any::~any((any *)0x1ee7e4);
  local_58 = local_10 + 0x60;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe58);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe58);
  do {
    bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (!bVar2) {
      this = fcall_guard::get((fcall_guard *)0x1eeb8e);
      cs_impl::any::any(this,(any *)in_stack_fffffffffffffe58);
LAB_001eebb1:
      fcall_guard::~fcall_guard((fcall_guard *)0x1eebbe);
      scope_guard::~scope_guard((scope_guard *)0x1eebcb);
      return (var)in_RDI;
    }
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator*(&local_78);
    statement_base::run((statement_base *)in_stack_fffffffffffffe60);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1eeb06);
    peVar4 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1eeb12);
    if ((peVar4->return_fcall & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1eeb28);
      peVar4 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1eeb34);
      peVar4->return_fcall = false;
      fcall_guard::get((fcall_guard *)0x1eeb48);
      cs_impl::any::any((any *)in_stack_fffffffffffffe60,(any *)in_stack_fffffffffffffe58);
      goto LAB_001eebb1;
    }
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
                  *)in_stack_fffffffffffffe60);
  } while( true );
}

Assistant:

var function::call_vv(const function *_this, vector &args)
	{
		current_process->poll_event();
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#else
		fcall_guard fcall;
#endif
		{
			var arg_list = var::make<cs::array>();
			auto &arr = arg_list.val<cs::array>();
			std::size_t i = 0;
			if (_this->mIsMemFn)
				_this->mContext->instance->storage.add_var_no_return("this", args[i++]);
			else if (_this->mIsLambda)
				_this->mContext->instance->storage.add_var_no_return("self", args[i++]);
			for (; i < args.size(); ++i)
				arr.push_back(args[i]);
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs.front(), arg_list);
		}
		for (auto &ptr: _this->mBody) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (_this->mContext->instance->return_fcall) {
				_this->mContext->instance->return_fcall = false;
				return fcall.get();
			}
		}
		return fcall.get();
	}